

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O2

uint8_t * __thiscall glTF2::Accessor::GetPointer(Accessor *this)

{
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar1;
  BufferView *pBVar2;
  vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *pvVar3;
  long lVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  pvVar1 = (this->bufferView).vector;
  if (pvVar1 != (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0) {
    pBVar2 = (pvVar1->super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>)
             ._M_impl.super__Vector_impl_data._M_start[(this->bufferView).index];
    pvVar3 = (pBVar2->buffer).vector;
    if (pvVar3 != (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0) {
      lVar4 = *(long *)(*(long *)&pvVar3->
                                  super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>
                       + (ulong)(pBVar2->buffer).index * 8);
      lVar5 = *(long *)(lVar4 + 0x70);
      if (lVar5 != 0) {
        uVar8 = pBVar2->byteOffset + this->byteOffset;
        puVar6 = *(ulong **)(lVar4 + 0x68);
        if (puVar6 != (ulong *)0x0) {
          uVar7 = *puVar6;
          if ((uVar7 <= uVar8) && (uVar8 < uVar7 + puVar6[3])) {
            return (uint8_t *)((uVar8 - uVar7) + puVar6[2]);
          }
        }
        return (uint8_t *)(lVar5 + uVar8);
      }
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

T* operator->()
            { return (*vector)[index]; }